

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O0

void __thiscall
icu_63::ZNames::ZNamesLoader::put
          (ZNamesLoader *this,char *key,ResourceValue *value,UBool param_3,UErrorCode *errorCode)

{
  UBool UVar1;
  int iVar2;
  int32_t local_5c;
  undefined1 local_58 [4];
  int32_t i;
  ResourceTable namesTable;
  UErrorCode *errorCode_local;
  UBool param_3_local;
  ResourceValue *value_local;
  char *key_local;
  ZNamesLoader *this_local;
  
  namesTable._32_8_ = errorCode;
  value_local = (ResourceValue *)key;
  key_local = (char *)this;
  (*(value->super_UObject)._vptr_UObject[0xb])(local_58,value,errorCode);
  UVar1 = ::U_FAILURE(*(UErrorCode *)namesTable._32_8_);
  if (UVar1 == '\0') {
    local_5c = 0;
    while (UVar1 = ResourceTable::getKeyAndValue
                             ((ResourceTable *)local_58,local_5c,(char **)&value_local,value),
          UVar1 != '\0') {
      iVar2 = (*(value->super_UObject)._vptr_UObject[0xc])();
      if ((char)iVar2 == '\0') {
        setNameIfEmpty(this,(char *)value_local,value,(UErrorCode *)namesTable._32_8_);
      }
      else {
        setNameIfEmpty(this,(char *)value_local,(ResourceValue *)0x0,(UErrorCode *)namesTable._32_8_
                      );
      }
      local_5c = local_5c + 1;
    }
  }
  return;
}

Assistant:

virtual void put(const char* key, ResourceValue& value, UBool /*noFallback*/,
            UErrorCode &errorCode) {
        ResourceTable namesTable = value.getTable(errorCode);
        if (U_FAILURE(errorCode)) { return; }
        for (int32_t i = 0; namesTable.getKeyAndValue(i, key, value); ++i) {
            if (value.isNoInheritanceMarker()) {
                setNameIfEmpty(key, NULL, errorCode);
            } else {
                setNameIfEmpty(key, &value, errorCode);
            }
        }
    }